

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fStencilTests.cpp
# Opt level: O0

IterateResult __thiscall deqp::gles2::Functional::StencilCase::iterate(StencilCase *this)

{
  allocator<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>_>
  *this_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint stencilBits_00;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  deUint32 dVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  deUint32 dVar12;
  RenderContext *pRVar13;
  undefined4 extraout_var;
  char *str;
  reference pvVar14;
  size_type sVar15;
  reference pvVar16;
  PixelFormat *pPVar17;
  float fVar18;
  pointer local_6650;
  bool local_663a;
  bool isOk;
  bool imagesOk;
  float threshold;
  undefined1 local_6590 [3];
  bool errorCodeOk;
  int ndx_2;
  MultisamplePixelBufferAccess local_6568;
  MultisamplePixelBufferAccess local_6540;
  ReferenceContextLimits local_6518;
  undefined1 local_64c0 [8];
  ReferenceContext context_1;
  undefined1 local_300 [8];
  ReferenceContextBuffers buffers;
  undefined1 local_280 [4];
  int ndx_1;
  GLContext context;
  int local_100;
  int local_fc;
  int x;
  int y;
  int cellHeight;
  int cellWidth;
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> cells;
  int ndx;
  vector<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>,_std::allocator<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>_>_>
  ops;
  char *failReason;
  undefined1 local_a8 [4];
  GLenum gles2Error;
  Surface refFrame;
  Surface gles2Frame;
  IVec4 viewport;
  int viewportY;
  undefined1 local_50 [4];
  int viewportX;
  Random rnd;
  TestLog *log;
  int height;
  int width;
  int gridSize;
  int numStencilValues;
  int stencilStep;
  int stencilBits;
  int depthBits;
  RenderTarget *renderTarget;
  StencilCase *this_local;
  RenderTarget *this_01;
  
  pRVar13 = Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar13->_vptr_RenderContext[4])();
  this_01 = (RenderTarget *)CONCAT44(extraout_var,iVar2);
  uVar3 = tcu::RenderTarget::getDepthBits(this_01);
  stencilBits_00 = tcu::RenderTarget::getStencilBits(this_01);
  iVar2 = 1;
  if (stencilBits_00 == 8) {
    iVar2 = 8;
  }
  numStencilValues._0_1_ = (byte)stencilBits_00;
  iVar4 = (1 << ((byte)numStencilValues & 0x1f)) / iVar2;
  fVar18 = deFloatSqrt((float)(iVar4 + 3));
  fVar18 = ::deFloatCeil(fVar18);
  iVar5 = (int)fVar18;
  iVar6 = tcu::RenderTarget::getWidth(this_01);
  iVar6 = ::deMin32(0x80,iVar6);
  iVar7 = tcu::RenderTarget::getHeight(this_01);
  iVar7 = ::deMin32(0x80,iVar7);
  rnd.m_rnd._8_8_ =
       tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  str = (char *)std::__cxx11::string::c_str();
  dVar8 = deStringHash(str);
  de::Random::Random((Random *)local_50,dVar8);
  iVar9 = tcu::RenderTarget::getWidth(this_01);
  iVar9 = de::Random::getInt((Random *)local_50,0,iVar9 - iVar6);
  iVar10 = tcu::RenderTarget::getHeight(this_01);
  iVar10 = de::Random::getInt((Random *)local_50,0,iVar10 - iVar7);
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&gles2Frame.m_pixels.m_cap,iVar9,iVar10,iVar6,iVar7)
  ;
  tcu::Surface::Surface((Surface *)&refFrame.m_pixels.m_cap,iVar6,iVar7);
  tcu::Surface::Surface((Surface *)local_a8,iVar6,iVar7);
  ops.
  super__Vector_base<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>,_std::allocator<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (allocator<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>_>
             *)((long)&cells.
                       super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::
  allocator<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>_>
  ::allocator(this_00);
  std::
  vector<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>,_std::allocator<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>_>_>
  ::vector((vector<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>,_std::allocator<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>_>_>
            *)&ndx,(long)(iVar4 + 3),this_00);
  std::
  allocator<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>_>
  ::~allocator((allocator<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>_>
                *)((long)&cells.
                          super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  for (cells.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
      (int)cells.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage < iVar4 + 1;
      cells.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ =
           (int)cells.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) {
    pvVar14 = std::
              vector<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>,_std::allocator<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>_>_>
              ::operator[]((vector<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>,_std::allocator<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>_>_>
                            *)&ndx,(long)(int)cells.
                                              super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    uVar11 = ::deMin32((int)cells.
                            super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage * iVar2,
                       (1 << ((byte)numStencilValues & 0x1f)) + -1);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
              (this,pvVar14,(ulong)stencilBits_00,(ulong)uVar3,(ulong)uVar11);
  }
  pvVar14 = std::
            vector<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>,_std::allocator<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>_>_>
            ::operator[]((vector<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>,_std::allocator<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>_>_>
                          *)&ndx,(long)(iVar4 + 1));
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
            (this,pvVar14,(ulong)stencilBits_00,(ulong)uVar3,
             (ulong)(uint)(1 << ((byte)numStencilValues & 0x1f)));
  pvVar14 = std::
            vector<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>,_std::allocator<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>_>_>
            ::operator[]((vector<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>,_std::allocator<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>_>_>
                          *)&ndx,(long)(iVar4 + 2));
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
            (this,pvVar14,(ulong)stencilBits_00,(ulong)uVar3,0xffffffff);
  std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::vector
            ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)&cellHeight);
  for (local_fc = 0; local_fc < iVar5; local_fc = local_fc + 1) {
    for (local_100 = 0; local_100 < iVar5; local_100 = local_100 + 1) {
      tcu::Vector<int,_4>::Vector
                ((Vector<int,_4> *)
                 &context.m_programs.
                  super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,local_100 * (iVar6 / iVar5),
                 local_fc * (iVar7 / iVar5),iVar6 / iVar5,iVar7 / iVar5);
      std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::push_back
                ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)&cellHeight,
                 (value_type *)
                 &context.m_programs.
                  super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
  }
  pRVar13 = Context::getRenderContext((this->super_TestCase).m_context);
  sglr::GLContext::GLContext
            ((GLContext *)local_280,pRVar13,(TestLog *)rnd.m_rnd._8_8_,0,
             (IVec4 *)&gles2Frame.m_pixels.m_cap);
  dVar8 = sglr::GLContext::createProgram
                    ((GLContext *)local_280,&(this->m_shader).super_ShaderProgram);
  this->m_shaderID = dVar8;
  sglr::GLContext::clearColor((GLContext *)local_280,1.0,0.0,0.0,1.0);
  sglr::GLContext::clear((GLContext *)local_280,0x4500);
  for (buffers.m_stencilbuffer.m_data.m_cap._4_4_ = 0;
      iVar4 = buffers.m_stencilbuffer.m_data.m_cap._4_4_,
      sVar15 = std::
               vector<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>,_std::allocator<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>_>_>
               ::size((vector<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>,_std::allocator<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>_>_>
                       *)&ndx), iVar4 < (int)sVar15;
      buffers.m_stencilbuffer.m_data.m_cap._4_4_ = buffers.m_stencilbuffer.m_data.m_cap._4_4_ + 1) {
    pvVar16 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                        ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)
                         &cellHeight,(long)buffers.m_stencilbuffer.m_data.m_cap._4_4_);
    pvVar14 = std::
              vector<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>,_std::allocator<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>_>_>
              ::operator[]((vector<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>,_std::allocator<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>_>_>
                            *)&ndx,(long)buffers.m_stencilbuffer.m_data.m_cap._4_4_);
    executeOps(this,(Context *)local_280,pvVar16,pvVar14);
  }
  visualizeStencil(this,(Context *)local_280,stencilBits_00,iVar2);
  dVar8 = sglr::GLContext::getError((GLContext *)local_280);
  sglr::Context::readPixels
            ((Context *)local_280,(Surface *)&refFrame.m_pixels.m_cap,0,0,iVar6,iVar7);
  sglr::GLContext::~GLContext((GLContext *)local_280);
  pPVar17 = tcu::RenderTarget::getPixelFormat(this_01);
  tcu::PixelFormat::PixelFormat
            ((PixelFormat *)
             &context_1.m_fragmentDepths.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,8,8,8,(uint)(pPVar17->alphaBits != 0) << 3);
  iVar4 = tcu::RenderTarget::getDepthBits(this_01);
  iVar5 = tcu::RenderTarget::getStencilBits(this_01);
  sglr::ReferenceContextBuffers::ReferenceContextBuffers
            ((ReferenceContextBuffers *)local_300,
             (PixelFormat *)
             &context_1.m_fragmentDepths.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,iVar4,iVar5,iVar6,iVar7,1);
  pRVar13 = Context::getRenderContext((this->super_TestCase).m_context);
  sglr::ReferenceContextLimits::ReferenceContextLimits(&local_6518,pRVar13);
  sglr::ReferenceContextBuffers::getColorbuffer(&local_6540,(ReferenceContextBuffers *)local_300);
  sglr::ReferenceContextBuffers::getDepthbuffer(&local_6568,(ReferenceContextBuffers *)local_300);
  sglr::ReferenceContextBuffers::getStencilbuffer
            ((MultisamplePixelBufferAccess *)local_6590,(ReferenceContextBuffers *)local_300);
  sglr::ReferenceContext::ReferenceContext
            ((ReferenceContext *)local_64c0,&local_6518,&local_6540,&local_6568,
             (MultisamplePixelBufferAccess *)local_6590);
  sglr::ReferenceContextLimits::~ReferenceContextLimits(&local_6518);
  dVar12 = sglr::ReferenceContext::createProgram
                     ((ReferenceContext *)local_64c0,&(this->m_shader).super_ShaderProgram);
  this->m_shaderID = dVar12;
  sglr::ReferenceContext::clearColor((ReferenceContext *)local_64c0,1.0,0.0,0.0,1.0);
  sglr::ReferenceContext::clear((ReferenceContext *)local_64c0,0x4500);
  for (threshold = 0.0;
      sVar15 = std::
               vector<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>,_std::allocator<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>_>_>
               ::size((vector<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>,_std::allocator<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>_>_>
                       *)&ndx), (int)threshold < (int)sVar15;
      threshold = (float)((int)threshold + 1)) {
    pvVar16 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                        ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)
                         &cellHeight,(long)(int)threshold);
    pvVar14 = std::
              vector<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>,_std::allocator<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>_>_>
              ::operator[]((vector<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>,_std::allocator<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>_>_>
                            *)&ndx,(long)(int)threshold);
    executeOps(this,(Context *)local_64c0,pvVar16,pvVar14);
  }
  visualizeStencil(this,(Context *)local_64c0,stencilBits_00,iVar2);
  sglr::Context::readPixels((Context *)local_64c0,(Surface *)local_a8,0,0,iVar6,iVar7);
  sglr::ReferenceContext::~ReferenceContext((ReferenceContext *)local_64c0);
  sglr::ReferenceContextBuffers::~ReferenceContextBuffers((ReferenceContextBuffers *)local_300);
  if ((dVar8 != 0) &&
     (ops.
      super__Vector_base<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>,_std::allocator<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0)) {
    ops.
    super__Vector_base<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>,_std::allocator<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)anon_var_dwarf_189bdb;
  }
  bVar1 = tcu::fuzzyCompare((TestLog *)rnd.m_rnd._8_8_,"ComparisonResult","Image comparison result",
                            (Surface *)local_a8,(Surface *)&refFrame.m_pixels.m_cap,0.02,
                            COMPARE_LOG_RESULT);
  if ((!bVar1) &&
     (ops.
      super__Vector_base<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>,_std::allocator<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0)) {
    ops.
    super__Vector_base<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>,_std::allocator<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)anon_var_dwarf_1102de;
  }
  local_663a = false;
  if (dVar8 == 0) {
    local_663a = bVar1;
  }
  if (local_663a == false) {
    local_6650 = ops.
                 super__Vector_base<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>,_std::allocator<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    local_6650 = (pointer)0xae33d5;
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
             (uint)(local_663a == false),(char *)local_6650);
  std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::~vector
            ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)&cellHeight);
  std::
  vector<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>,_std::allocator<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>_>_>
  ::~vector((vector<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>,_std::allocator<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>_>_>
             *)&ndx);
  tcu::Surface::~Surface((Surface *)local_a8);
  tcu::Surface::~Surface((Surface *)&refFrame.m_pixels.m_cap);
  de::Random::~Random((Random *)local_50);
  return STOP;
}

Assistant:

TestCase::IterateResult StencilCase::iterate (void)
{
	const tcu::RenderTarget&	renderTarget		= m_context.getRenderContext().getRenderTarget();
	int							depthBits			= renderTarget.getDepthBits();
	int							stencilBits			= renderTarget.getStencilBits();

	int							stencilStep			= stencilBits == 8 ? 8 : 1;
	int							numStencilValues	= (1<<stencilBits)/stencilStep + 1;

	int							gridSize			= (int)deFloatCeil(deFloatSqrt((float)(numStencilValues+2)));

	int							width				= deMin32(128, renderTarget.getWidth());
	int							height				= deMin32(128, renderTarget.getHeight());

	tcu::TestLog&				log					= m_testCtx.getLog();
	de::Random					rnd					(deStringHash(m_name.c_str()));
	int							viewportX			= rnd.getInt(0, renderTarget.getWidth()-width);
	int							viewportY			= rnd.getInt(0, renderTarget.getHeight()-height);
	IVec4						viewport			= IVec4(viewportX, viewportY, width, height);

	tcu::Surface				gles2Frame			(width, height);
	tcu::Surface				refFrame			(width, height);
	GLenum						gles2Error;

	const char*					failReason			= DE_NULL;

	// Get ops for stencil values
	vector<vector<StencilOp> >	ops(numStencilValues+2);
	{
		// Values from 0 to max
		for (int ndx = 0; ndx < numStencilValues; ndx++)
			genOps(ops[ndx], stencilBits, depthBits, deMin32(ndx*stencilStep, (1<<stencilBits)-1));

		// -1 and max+1
		genOps(ops[numStencilValues+0], stencilBits, depthBits, 1<<stencilBits);
		genOps(ops[numStencilValues+1], stencilBits, depthBits, -1);
	}

	// Compute cells: (x, y, w, h)
	vector<IVec4>				cells;
	int							cellWidth			= width/gridSize;
	int							cellHeight			= height/gridSize;
	for (int y = 0; y < gridSize; y++)
	for (int x = 0; x < gridSize; x++)
		cells.push_back(IVec4(x*cellWidth, y*cellHeight, cellWidth, cellHeight));

	DE_ASSERT(ops.size() <= cells.size());

	// Execute for gles2 context
	{
		sglr::GLContext context(m_context.getRenderContext(), log, 0 /* don't log calls or program */, viewport);

		m_shaderID = context.createProgram(&m_shader);

		context.clearColor(1.0f, 0.0f, 0.0f, 1.0f);
		context.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

		for (int ndx = 0; ndx < (int)ops.size(); ndx++)
			executeOps(context, cells[ndx], ops[ndx]);

		visualizeStencil(context, stencilBits, stencilStep);

		gles2Error = context.getError();
		context.readPixels(gles2Frame, 0, 0, width, height);
	}

	// Execute for reference context
	{
		sglr::ReferenceContextBuffers	buffers	(tcu::PixelFormat(8,8,8,renderTarget.getPixelFormat().alphaBits?8:0), renderTarget.getDepthBits(), renderTarget.getStencilBits(), width, height);
		sglr::ReferenceContext			context	(sglr::ReferenceContextLimits(m_context.getRenderContext()), buffers.getColorbuffer(), buffers.getDepthbuffer(), buffers.getStencilbuffer());

		m_shaderID = context.createProgram(&m_shader);

		context.clearColor(1.0f, 0.0f, 0.0f, 1.0f);
		context.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

		for (int ndx = 0; ndx < (int)ops.size(); ndx++)
			executeOps(context, cells[ndx], ops[ndx]);

		visualizeStencil(context, stencilBits, stencilStep);

		context.readPixels(refFrame, 0, 0, width, height);
	}

	// Check error
	bool errorCodeOk = (gles2Error == GL_NO_ERROR);
	if (!errorCodeOk && !failReason)
		failReason = "Got unexpected error";

	// Compare images
	const float		threshold	= 0.02f;
	bool			imagesOk	= tcu::fuzzyCompare(log, "ComparisonResult", "Image comparison result", refFrame, gles2Frame, threshold, tcu::COMPARE_LOG_RESULT);

	if (!imagesOk && !failReason)
		failReason = "Image comparison failed";

	// Store test result
	bool isOk = errorCodeOk && imagesOk;
	m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
							isOk ? "Pass"				: failReason);

	return STOP;
}